

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

IntervalMap<unsigned_long,_std::monostate,_3U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
          (IntervalMap<unsigned_long,_std::monostate,_3U> *this,
          IntervalMap<unsigned_long,_std::monostate,_3U> *other,allocator_type *alloc)

{
  bool bVar1;
  unsigned_long *puVar2;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  unsigned_long right;
  unsigned_long left;
  pair<unsigned_long,_unsigned_long> rkey;
  pair<unsigned_long,_unsigned_long> lkey;
  const_iterator rend;
  const_iterator lend;
  const_iterator rit;
  const_iterator lit;
  IntervalMap<unsigned_long,_std::monostate,_3U> *result;
  const_iterator *in_stack_fffffffffffffe48;
  const_iterator *in_stack_fffffffffffffe50;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_fffffffffffffe68;
  unsigned_long in_stack_fffffffffffffe70;
  byte local_17a;
  pair<unsigned_long,_unsigned_long> pVar5;
  unsigned_long in_stack_fffffffffffffec0;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_fffffffffffffed0;
  const_iterator *this_00;
  
  IntervalMap(in_RDI);
  begin(in_stack_fffffffffffffe68);
  begin(in_stack_fffffffffffffe68);
  end(in_stack_fffffffffffffe68);
  end(in_stack_fffffffffffffe68);
  pVar3.second = in_stack_fffffffffffffe70;
  pVar3.first = in_stack_fffffffffffffec0;
  while( true ) {
    bVar1 = const_iterator::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_17a = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = const_iterator::operator==(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_17a = bVar1 ^ 0xff;
    }
    if ((local_17a & 1) == 0) break;
    pVar3 = const_iterator::bounds((const_iterator *)pVar3.second);
    this_00 = (const_iterator *)pVar3.second;
    pVar4 = const_iterator::bounds(this_00);
    if (this_00 < (const_iterator *)pVar4.first) {
      const_iterator::operator++(in_stack_fffffffffffffe50);
    }
    else if (pVar4.second < pVar3.first) {
      const_iterator::operator++(in_stack_fffffffffffffe50);
    }
    else {
      pVar5 = pVar4;
      puVar2 = std::max<unsigned_long>
                         ((unsigned_long *)&stack0xfffffffffffffec0,
                          (unsigned_long *)&stack0xfffffffffffffeb0);
      in_stack_fffffffffffffe48 = (const_iterator *)*puVar2;
      puVar2 = std::min<unsigned_long>
                         ((unsigned_long *)&stack0xfffffffffffffec8,
                          (unsigned_long *)&stack0xfffffffffffffeb8);
      in_stack_fffffffffffffe50 = (const_iterator *)*puVar2;
      const_iterator::operator*((const_iterator *)pVar4.second);
      unionWith(in_stack_fffffffffffffed0,(unsigned_long)this_00,pVar3.first,
                (monostate *)pVar5.second,(allocator_type *)pVar5.first);
      if (this_00 < (const_iterator *)pVar5.second) {
        const_iterator::operator++(in_stack_fffffffffffffe50);
      }
      else {
        const_iterator::operator++(in_stack_fffffffffffffe50);
      }
    }
  }
  const_iterator::~const_iterator((const_iterator *)0xb082d3);
  const_iterator::~const_iterator((const_iterator *)0xb082e0);
  const_iterator::~const_iterator((const_iterator *)0xb082ed);
  const_iterator::~const_iterator((const_iterator *)0xb082fa);
  return in_RDI;
}

Assistant:

IntervalMap<TKey, TValue, N> IntervalMap<TKey, TValue, N>::intersection(
    const IntervalMap& other, allocator_type& alloc) const {

    IntervalMap result;
    auto lit = begin(), rit = other.begin();
    auto lend = end(), rend = other.end();
    while (lit != lend && rit != rend) {
        auto lkey = lit.bounds(), rkey = rit.bounds();
        if (lkey.second < rkey.first) {
            ++lit;
        }
        else if (rkey.second < lkey.first) {
            ++rit;
        }
        else {
            // We will arbitrarily take the left hand value,
            // since there's no way to merge them. Presumably if
            // this method is being called the values don't matter.
            auto left = std::max(lkey.first, rkey.first);
            auto right = std::min(lkey.second, rkey.second);
            result.unionWith(left, right, *lit, alloc);

            if (lkey.second < rkey.second)
                ++lit;
            else
                ++rit;
        }
    }
    return result;
}